

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O1

void __thiscall
mp::ArrayRef<int>::init_from_rvalue<mp::ArrayRef<int>>(ArrayRef<int> *this,ArrayRef<int> *other)

{
  pointer piVar1;
  pointer piVar2;
  size_t sVar3;
  
  if ((other->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      (other->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    this->data_ = other->data_;
    sVar3 = other->size_;
  }
  else {
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->save_);
    piVar1 = (this->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this->data_ = piVar1;
    sVar3 = (long)piVar2 - (long)piVar1 >> 2;
  }
  this->size_ = sVar3;
  return;
}

Assistant:

void init_from_rvalue(AR&& other) noexcept {
      if (other.save_.size()) {
        save_ = std::move(other.save_);
        data_ = save_.data();
        size_ = save_.size();
      }
      else {
        data_ = other.data();
        size_ = other.size();
      }
    }